

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O3

void ihevc_weighted_pred_bi
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0,WORD32 off0,WORD32 wgt1,WORD32 off1,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  if (0 < ht) {
    iVar2 = 0;
    do {
      if (0 < wd) {
        uVar3 = 0;
        do {
          iVar4 = (pi2_src2[uVar3] + lvl_shift2) * wgt1 +
                  (pi2_src1[uVar3] + lvl_shift1) * wgt0 +
                  (off0 + off1 + 1 << ((byte)shift - 1 & 0x1f));
          bVar1 = (byte)shift & 0x1f;
          if (iVar4 >> bVar1 < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> bVar1;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pu1_dst[uVar3] = (UWORD8)iVar4;
          uVar3 = uVar3 + 1;
        } while ((uint)wd != uVar3);
      }
      pu1_dst = pu1_dst + dst_strd;
      iVar2 = iVar2 + 1;
      pi2_src2 = pi2_src2 + src_strd2;
      pi2_src1 = pi2_src1 + src_strd1;
    } while (iVar2 != ht);
  }
  return;
}

Assistant:

void ihevc_weighted_pred_bi(WORD16 *pi2_src1,
                            WORD16 *pi2_src2,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd1,
                            WORD32 src_strd2,
                            WORD32 dst_strd,
                            WORD32 wgt0,
                            WORD32 off0,
                            WORD32 wgt1,
                            WORD32 off1,
                            WORD32 shift,
                            WORD32 lvl_shift1,
                            WORD32 lvl_shift2,
                            WORD32 ht,
                            WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i4_tmp = (pi2_src1[col] + lvl_shift1) * wgt0;
            i4_tmp += (pi2_src2[col] + lvl_shift2) * wgt1;
            i4_tmp += (off0 + off1 + 1) << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}